

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

int glu::anon_unknown_4::getVtxCompSize(VertexComponentType type)

{
  int local_c;
  VertexComponentType type_local;
  
  switch(type) {
  case VTX_COMP_UNSIGNED_INT8:
    local_c = 1;
    break;
  case VTX_COMP_UNSIGNED_INT16:
    local_c = 2;
    break;
  case VTX_COMP_UNSIGNED_INT32:
    local_c = 4;
    break;
  case VTX_COMP_SIGNED_INT8:
    local_c = 1;
    break;
  case VTX_COMP_SIGNED_INT16:
    local_c = 2;
    break;
  case VTX_COMP_SIGNED_INT32:
    local_c = 4;
    break;
  case VTX_COMP_FIXED:
    local_c = 4;
    break;
  case VTX_COMP_HALF_FLOAT:
    local_c = 2;
    break;
  case VTX_COMP_FLOAT:
    local_c = 4;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getVtxCompSize (VertexComponentType type)
{
	switch (type)
	{
		case VTX_COMP_UNSIGNED_INT8:	return 1;
		case VTX_COMP_UNSIGNED_INT16:	return 2;
		case VTX_COMP_UNSIGNED_INT32:	return 4;
		case VTX_COMP_SIGNED_INT8:		return 1;
		case VTX_COMP_SIGNED_INT16:		return 2;
		case VTX_COMP_SIGNED_INT32:		return 4;
		case VTX_COMP_FIXED:			return 4;
		case VTX_COMP_HALF_FLOAT:		return 2;
		case VTX_COMP_FLOAT:			return 4;
		default:
			DE_ASSERT(false);
			return 0;
	}
}